

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdx86_decoder.c
# Opt level: O1

NDSTATUS NdLegacyPrefixChecks(INSTRUX *Instrux)

{
  ND_UINT8 NVar1;
  byte bVar2;
  uint uVar3;
  ushort uVar4;
  NDSTATUS NVar5;
  ushort uVar6;
  ushort uVar7;
  
  uVar3 = *(uint *)&Instrux->field_0x5;
  if (((char)uVar3 < '\0') &&
     (((Instrux->Attributes & 0x1000) == 0 ||
      (((undefined1  [488])*Instrux & (undefined1  [488])0x3) != (undefined1  [488])0x1)))) {
    if (((ushort)Instrux->ValidPrefixes & 4) == 0) {
      return 0x8000000a;
    }
    if ((undefined1  [32])((undefined1  [32])Instrux->Operands[0] & (undefined1  [32])0xf) !=
        (undefined1  [32])0x2) {
      return 0x8000000a;
    }
    Instrux->field_0x9 = Instrux->field_0x9 | 4;
  }
  NVar1 = Instrux->Rep;
  if (NVar1 != '\0') {
    if ((Instrux->Attributes & 0x100000000) != 0) {
      return 0x80000002;
    }
    uVar6 = (Instrux->ValidPrefixes).Raw;
    uVar7 = *(ushort *)&Instrux->field_0x9;
    uVar4 = 0x400;
    if ((uVar6 & 1) == 0) {
      uVar4 = (uVar6 & 2) << 9;
    }
    uVar4 = (ushort)(NVar1 == 0xf2) << 8 & uVar6 * 4 | (uVar7 & 0xfae7) + (uVar6 & 3) * 8 | uVar4;
    *(ushort *)&Instrux->field_0x9 = uVar4;
    if ((((uVar6 & 0x100) != 0 || (uVar7 & 4) != 0) &&
        ((undefined1  [32])((undefined1  [32])Instrux->Operands[0] & (undefined1  [32])0xf) ==
         (undefined1  [32])0x2)) &&
       ((uVar7 = 0x20, NVar1 == 0xf2 && (uVar6 & 0x18) != 0 ||
        (uVar7 = 0x40, NVar1 == 0xf3 && (uVar6 & 0x28) != 0)))) {
      *(ushort *)&Instrux->field_0x9 = uVar7 | uVar4;
    }
  }
  bVar2 = Instrux->Seg;
  if (bVar2 != 0) {
    if ((char)(Instrux->ValidPrefixes).Raw < '\0') {
      uVar6 = 0x80;
      if ((bVar2 | 0x10) != 0x3e) {
        uVar6 = (ushort)(bVar2 == 100) << 7;
      }
    }
    else {
      uVar6 = 0;
    }
    *(ushort *)&Instrux->field_0x9 =
         (ushort)(bVar2 == 0x3e) << 9 & (Instrux->ValidPrefixes).Raw |
         uVar6 | *(ushort *)&Instrux->field_0x9 & 0xfd7f;
  }
  if ((((uVar3 & 0x20) == 0) || (NVar5 = 0x80000002, (Instrux->Attributes & 0x4000000) == 0)) &&
     ((((uVar3 & 0x40) == 0 || (NVar5 = 0x80000002, (Instrux->Attributes & 0x200000000) == 0)) &&
      (((uVar3 & 2) == 0 || (NVar5 = 0x80000002, (Instrux->Attributes & 0x80000000) == 0)))))) {
    NVar5 = 0;
    uVar6 = 0;
    if ((Instrux->Attributes & 0x800000) != 0) {
      uVar6 = (~*(ushort *)&Instrux->field_0x9 & 0x200) << 2;
    }
    *(ushort *)&Instrux->field_0x9 = uVar6 | *(ushort *)&Instrux->field_0x9 & 0xf7ff;
  }
  return NVar5;
}

Assistant:

static NDSTATUS
NdLegacyPrefixChecks(
    INSTRUX *Instrux
    )
{
    // These checks only apply to legacy encoded instructions.

    // Check for LOCK. LOCK can be present only in two cases:
    // 1. For certain RMW instructions, as long as the destination operand is memory
    // 2. For MOV to/from CR0 in 32-bit mode on AMD CPUs, which allows access to CR8
    // For XOP/VEX/EVEX instructions, a #UD is generated (which is checked when fetching the XOP/VEX/EVEX prefix).
    if (Instrux->HasLock)
    {
        if (0 != (Instrux->Attributes & ND_FLAG_LOCK_SPECIAL) && (ND_CODE_32 == Instrux->DefCode))
        {
            // Special case of LOCK being used by MOV cr to access CR8.
        }
        else if (Instrux->ValidPrefixes.Lock && (Instrux->Operands[0].Type == ND_OP_MEM))
        {
            Instrux->IsLockEnabled = 1;
        }
        else
        {
            return ND_STATUS_BAD_LOCK_PREFIX;
        }
    }

    // Chec for REP prefixes. There are multiple uses:
    // 1. REP/REPNZ/REPZ, for string/IO instructions
    // 2. XACQUIRE/XRELEASE, for HLE-enabled instructions
    // 3. BND prefix, for branches
    // For XOP/VEX/EVEX instructions, a #UD is generated (which is checked when fetching the XOP/VEX/EVEX prefix).
    if (Instrux->Rep != 0)
    {
        if (Instrux->Attributes & ND_FLAG_NOREP)
        {
            return ND_STATUS_INVALID_ENCODING;
        }

        Instrux->IsRepEnabled = Instrux->ValidPrefixes.Rep != 0;

        Instrux->IsRepcEnabled = Instrux->ValidPrefixes.RepCond != 0;

        // Bound enablement.
        Instrux->IsBndEnabled = (Instrux->ValidPrefixes.Bnd != 0) && (Instrux->Rep == ND_PREFIX_G1_BND);

        // Check if the instruction is REPed.
        Instrux->IsRepeated = Instrux->IsRepEnabled || Instrux->IsRepcEnabled;

        // Check if the instruction is XACQUIRE or XRELEASE enabled.
        if ((Instrux->IsLockEnabled || Instrux->ValidPrefixes.HleNoLock) &&
            (Instrux->Operands[0].Type == ND_OP_MEM))
        {
            if ((Instrux->ValidPrefixes.Xacquire || Instrux->ValidPrefixes.Hle) && 
                (Instrux->Rep == ND_PREFIX_G1_XACQUIRE))
            {
                Instrux->IsXacquireEnabled = ND_TRUE;
            }
            else if ((Instrux->ValidPrefixes.Xrelease || Instrux->ValidPrefixes.Hle) && 
                (Instrux->Rep == ND_PREFIX_G1_XRELEASE))
            {
                Instrux->IsXreleaseEnabled = ND_TRUE;
            }
        }
    }

    // Check for segment prefixes. Besides offering segment override when accessing memory:
    // 1. Allow for branch hints to conditional branches
    // 2. Allow for Do Not Track prefix for indirect branches, to inhibit CET-IBT tracking
    // Segment prefixes are allowed with XOP/VEX/EVEX instructions, but they have the legacy meaning (no BHINT or DNT).
    if (Instrux->Seg != 0)
    {
        // Branch hint enablement.
        Instrux->IsBhintEnabled = Instrux->ValidPrefixes.Bhint && (
            (Instrux->Seg == ND_PREFIX_G2_BR_TAKEN) ||
            (Instrux->Seg == ND_PREFIX_G2_BR_NOT_TAKEN) ||
            (Instrux->Seg == ND_PREFIX_G2_BR_ALT));

        // Do-not-track hint enablement.
        Instrux->IsDntEnabled = Instrux->ValidPrefixes.Dnt && (Instrux->Seg == ND_PREFIX_G2_NO_TRACK);
    }

    // For XOP/VEX/EVEX instructions, a #UD is generated (which is checked when fetching the XOP/VEX/EVEX prefix).
    if (Instrux->HasOpSize && (Instrux->Attributes & ND_FLAG_NO66))
    {
        return ND_STATUS_INVALID_ENCODING;
    }

    // Address size override is allowed with all XOP/VEX/EVEX prefixes.
    if (Instrux->HasAddrSize && (Instrux->Attributes & ND_FLAG_NO67))
    {
        return ND_STATUS_INVALID_ENCODING;
    }

    // For XOP/VEX/EVEX instructions, a #UD is generated (which is checked when fetching the XOP/VEX/EVEX prefix).
    if (Instrux->HasRex2 && (Instrux->Attributes & ND_FLAG_NOREX2))
    {
        return ND_STATUS_INVALID_ENCODING;
    }

    // Check if the instruction is CET tracked. The do not track prefix (0x3E) works only for indirect near JMP and CALL
    // instructions. It is always enabled for far JMP and CALL instructions.
    Instrux->IsCetTracked = ND_HAS_CETT(Instrux) && !Instrux->IsDntEnabled;

    return ND_STATUS_SUCCESS;
}